

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_pipeline_library
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *pipelines,
          Value *lib_info,ResourceTag tag,VkPipelineLibraryCreateInfoKHR **out_info)

{
  bool bVar1;
  Type pGVar2;
  VkPipelineLibraryCreateInfoKHR *pVVar3;
  VkPipeline *out_pipeline;
  ValueIterator pGVar4;
  Number NVar5;
  ulong uVar6;
  Value *state;
  undefined8 local_38;
  
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)lib_info,"libraries");
  pVVar3 = (VkPipelineLibraryCreateInfoKHR *)
           ScratchAllocator::allocate_raw(&this->allocator,0x20,0x10);
  if (pVVar3 != (VkPipelineLibraryCreateInfoKHR *)0x0) {
    *(undefined8 *)&pVVar3->libraryCount = 0;
    pVVar3->pLibraries = (VkPipeline *)0x0;
    *(undefined8 *)pVVar3 = 0;
    pVVar3->pNext = (void *)0x0;
  }
  if ((pGVar2->data_).f.flags == 4) {
    uVar6 = (ulong)(pGVar2->data_).s.length;
    if (uVar6 == 0) {
      out_pipeline = (VkPipeline *)0x0;
    }
    else {
      out_pipeline = (VkPipeline *)ScratchAllocator::allocate_raw(&this->allocator,uVar6 << 3,0x10);
    }
    pVVar3->sType = VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR;
    if ((pGVar2->data_).f.flags == 4) {
      pVVar3->libraryCount = (pGVar2->data_).s.length;
      pVVar3->pLibraries = out_pipeline;
      if ((pGVar2->data_).f.flags != 4) {
        __assert_fail("IsArray()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                      ,0x68c,
                      "ValueIterator rapidjson::GenericValue<rapidjson::UTF8<>>::Begin() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      state = (Value *)((ulong)(pGVar2->data_).s.str & 0xffffffffffff);
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::End(pGVar2);
      if (pGVar4 != state) {
        do {
          bVar1 = parse_derived_pipeline_handle
                            (this,iface,resolver,state,pipelines,tag,out_pipeline);
          if (!bVar1) {
            return false;
          }
          state = state + 1;
          out_pipeline = out_pipeline + 1;
          pGVar4 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::End(pGVar2);
        } while (state != pGVar4);
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&stack0xffffffffffffffc8,(Ch *)lib_info);
      NVar5.i = (I)rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::MemberEnd(lib_info);
      if (local_38 != NVar5.i64) {
        pGVar2 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)lib_info,"pNext");
        bVar1 = parse_pnext_chain(this,pGVar2,&pVVar3->pNext,(StateCreatorInterface *)0x0,
                                  (DatabaseInterface *)0x0,(Value *)0x0);
        if (!bVar1) {
          return false;
        }
      }
      *out_info = pVVar3;
      return true;
    }
  }
  __assert_fail("IsArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x66a,
                "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_pipeline_library(
		StateCreatorInterface &iface, DatabaseInterface *resolver,
		const Value &pipelines,
		const Value &lib_info, ResourceTag tag,
		VkPipelineLibraryCreateInfoKHR **out_info)
{
	auto &library_list = lib_info["libraries"];
	auto *library_info = allocator.allocate_cleared<VkPipelineLibraryCreateInfoKHR>();
	auto *libraries = allocator.allocate_n<VkPipeline>(library_list.Size());

	library_info->sType = VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR;
	library_info->libraryCount = library_list.Size();
	library_info->pLibraries = libraries;

	for (auto itr = library_list.Begin(); itr != library_list.End(); ++itr, libraries++)
		if (!parse_derived_pipeline_handle(iface, resolver, *itr, pipelines, tag, libraries))
			return false;

	if (lib_info.HasMember("pNext"))
		if (!parse_pnext_chain(lib_info["pNext"], &library_info->pNext))
			return false;

	*out_info = library_info;
	return true;
}